

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

bool __thiscall Assembler::checkIfJump(Assembler *this,string *line)

{
  bool bVar1;
  bool bVar2;
  AddressingError *this_00;
  bool local_282;
  string local_258;
  byte local_231;
  string local_230;
  byte local_209;
  string local_208;
  byte local_1e1;
  string local_1e0;
  byte local_1b9;
  string local_1b8;
  byte local_191;
  string local_190;
  byte local_169;
  string local_168;
  byte local_141;
  string local_140;
  byte local_119;
  string local_118;
  byte local_f1;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 local_90 [8];
  string operand;
  string instruction;
  undefined1 local_40 [8];
  smatch jump;
  string *line_local;
  Assembler *this_local;
  
  jump._M_begin._M_current = (char *)line;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_40);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (line,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_40,&jumpInstructionsReg_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((string_type *)((long)&operand.field_2 + 8),
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)local_40,1);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((string_type *)local_90,
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)local_40,2);
    local_f1 = 0;
    local_119 = 0;
    local_141 = 0;
    local_169 = 0;
    local_191 = 0;
    local_1b9 = 0;
    local_1e1 = 0;
    local_209 = 0;
    local_231 = 0;
    bVar1 = false;
    std::__cxx11::string::string((string *)&local_b0,(string *)(operand.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&local_d0,(string *)local_90);
    bVar2 = checkIfJumpRegDir(this,&local_b0,&local_d0);
    local_282 = true;
    if (!bVar2) {
      std::__cxx11::string::string((string *)&local_f0,(string *)(operand.field_2._M_local_buf + 8))
      ;
      local_f1 = 1;
      std::__cxx11::string::string((string *)&local_118,(string *)local_90);
      local_119 = 1;
      bVar2 = checkIfJumpAbsolute(this,&local_f0,&local_118);
      local_282 = true;
      if (!bVar2) {
        std::__cxx11::string::string
                  ((string *)&local_140,(string *)(operand.field_2._M_local_buf + 8));
        local_141 = 1;
        std::__cxx11::string::string((string *)&local_168,(string *)local_90);
        local_169 = 1;
        bVar2 = checkIfJumpMemDir(this,&local_140,&local_168);
        local_282 = true;
        if (!bVar2) {
          std::__cxx11::string::string
                    ((string *)&local_190,(string *)(operand.field_2._M_local_buf + 8));
          local_191 = 1;
          std::__cxx11::string::string((string *)&local_1b8,(string *)local_90);
          local_1b9 = 1;
          bVar2 = checkIfJumpPcRel(this,&local_190,&local_1b8);
          local_282 = true;
          if (!bVar2) {
            std::__cxx11::string::string
                      ((string *)&local_1e0,(string *)(operand.field_2._M_local_buf + 8));
            local_1e1 = 1;
            std::__cxx11::string::string((string *)&local_208,(string *)local_90);
            local_209 = 1;
            bVar2 = checkIfJumpRegInd(this,&local_1e0,&local_208);
            local_282 = true;
            if (!bVar2) {
              std::__cxx11::string::string
                        ((string *)&local_230,(string *)(operand.field_2._M_local_buf + 8));
              local_231 = 1;
              std::__cxx11::string::string((string *)&local_258,(string *)local_90);
              bVar1 = true;
              local_282 = checkIfJumpRegIndDis(this,&local_230,&local_258);
            }
          }
        }
      }
    }
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_258);
    }
    if ((local_231 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_230);
    }
    if ((local_209 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_208);
    }
    if ((local_1e1 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    if ((local_1b9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    if ((local_191 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_190);
    }
    if ((local_169 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_168);
    }
    if ((local_141 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_140);
    }
    if ((local_119 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_118);
    }
    if ((local_f1 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_f0);
    }
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    if (local_282 == false) {
      this_00 = (AddressingError *)__cxa_allocate_exception(8);
      *this_00 = (AddressingError)0x0;
      AddressingError::AddressingError(this_00);
      __cxa_throw(this_00,&AddressingError::typeinfo,AddressingError::~AddressingError);
    }
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)(operand.field_2._M_local_buf + 8));
  }
  else {
    this_local._7_1_ = false;
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_40);
  return this_local._7_1_;
}

Assistant:

bool Assembler::checkIfJump(string line) {
    smatch jump;
    if (regex_match(line, jump, jumpInstructionsReg)) {
        string instruction = jump.str(1);
        string operand = jump.str(2);
        if (checkIfJumpRegDir(instruction, operand) || checkIfJumpAbsolute(instruction, operand) ||
            checkIfJumpMemDir(instruction, operand) ||
            checkIfJumpPcRel(instruction, operand)
            || checkIfJumpRegInd(instruction, operand) ||
            checkIfJumpRegIndDis(instruction, operand))
            return true;
        else throw AddressingError();
    }
    return false;
}